

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,2,2>,tcu::Vector<float,2>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  undefined1 *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FloatFormat *fmt_00;
  TestLog *this_01;
  MessageBuilder *pMVar5;
  reference ppFVar6;
  TestLog *this_02;
  ostream *poVar7;
  char *pcVar8;
  RenderContext *pRVar9;
  ulong uVar10;
  Variable<tcu::Vector<float,_2>_> *pVVar11;
  reference pvVar12;
  Variable<tcu::Matrix<float,_2,_2>_> *pVVar13;
  ShaderExecutor *pSVar14;
  undefined8 extraout_RAX;
  TestError *this_03;
  Variable<deqp::gls::BuiltinPrecisionTests::Void> *pVVar15;
  FloatFormat *pFVar16;
  IVal *pIVar17;
  const_reference pvVar18;
  reference value;
  reference value_00;
  TestLog *this_04;
  TestLog *this_05;
  TestLog *this_06;
  TestLog *this_07;
  double *value_01;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar21;
  undefined4 extraout_XMM0_Db_03;
  double dVar20;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  char (*local_15f0) [7];
  pointer local_14b0;
  MessageBuilder local_14a0;
  MessageBuilder local_1320;
  int local_119c;
  MessageBuilder local_1198;
  string local_1018;
  string local_ff8;
  string local_fd8;
  string local_fb8;
  string local_f98;
  string local_f78;
  string local_f58;
  string local_f38;
  string local_f18;
  string local_ef8;
  string local_ed8;
  string local_eb8;
  string local_e98;
  string local_e78;
  undefined1 local_e58 [8];
  MessageBuilder builder;
  string local_cd0;
  IVal local_cb0;
  allocator<char> local_c49;
  string local_c48;
  undefined1 local_c28 [32];
  double local_c08;
  double dStack_c00;
  undefined1 local_bf8 [8];
  EvalContext ctx;
  IVal local_bae [4];
  IVal local_baa [2];
  IVal local_ba8;
  IVal local_b78;
  undefined1 auStack_b48 [8];
  IVal reference1_1;
  undefined1 local_b10 [8];
  IVal reference0_1;
  pointer pVStack_aa8;
  bool result;
  size_t valueNdx;
  IVal reference1;
  IVal reference0;
  undefined1 local_a08 [5];
  IVal in3;
  IVal in2;
  IVal in1;
  IVal in0;
  void *outputArr [2];
  void *inputArr [4];
  DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor> local_999;
  undefined1 local_998 [8];
  UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  executor;
  Symbol local_968;
  Symbol local_930;
  Symbol local_8f8;
  Symbol local_8c0;
  Symbol local_888;
  Symbol local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  ApiType local_7d4;
  string local_7d0 [32];
  ostringstream local_7b0 [8];
  ostringstream os;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  MessageBuilder local_618;
  _Self local_498;
  _Self local_490;
  const_iterator it;
  FuncSet funcs;
  ostringstream oss;
  MessageBuilder local_2e0;
  undefined1 local_160 [8];
  Environment env;
  int numErrors;
  int maxMsgs;
  FloatFormat highpFmt;
  undefined1 local_e8 [8];
  ShaderSpec spec;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  outputs;
  size_t numValues;
  int outCount;
  int inCount;
  FloatFormat *fmt;
  Statement *stmt_local;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *inputs_local;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  *variables_local;
  PrecisionCase *this_local;
  
  fmt_00 = getFormat(this);
  iVar2 = numInputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
                    ();
  iVar3 = numOutputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,2,2>,tcu::Vector<float,2>>>
                    ();
  if (iVar2 < 1) {
    local_14b0 = (pointer)&DAT_00000001;
  }
  else {
    local_14b0 = (pointer)std::
                          vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                          size(&inputs->in0);
  }
  outputs.out1.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_14b0;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
  ::Outputs((Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
             *)((long)&spec.source.field_2 + 8),(size_t)local_14b0);
  ShaderExecUtil::ShaderSpec::ShaderSpec((ShaderSpec *)local_e8);
  highpFmt._24_8_ = (this->m_ctx).highpFormat.m_maxValue;
  numErrors = (this->m_ctx).highpFormat.m_minExp;
  unique0x100014eb = (this->m_ctx).highpFormat.m_maxExp;
  highpFmt.m_minExp = (this->m_ctx).highpFormat.m_fractionBits;
  highpFmt.m_maxExp = (this->m_ctx).highpFormat.m_hasSubnormal;
  highpFmt.m_fractionBits = (this->m_ctx).highpFormat.m_hasInf;
  highpFmt.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasNaN;
  highpFmt._16_8_ = *(undefined8 *)&(this->m_ctx).highpFormat.m_exactPrecision;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 100;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  Environment::Environment((Environment *)local_160);
  switch(iVar2) {
  case 4:
  case 3:
  case 2:
  case 1:
  default:
    log(this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    tcu::TestLog::operator<<(&local_2e0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_2e0,(char (*) [12])"Statement: ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,stmt);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2e0);
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
    ::set((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
           *)&it);
    Statement::getUsedFuncs
              (stmt,(set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
                     *)&it);
    local_490._M_node =
         (_Base_ptr)
         std::
         set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
         ::begin((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
                  *)&it);
    while( true ) {
      local_498._M_node =
           (_Base_ptr)
           std::
           set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
           ::end((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
                  *)&it);
      bVar1 = std::operator!=(&local_490,&local_498);
      if (!bVar1) break;
      ppFVar6 = std::_Rb_tree_const_iterator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>::
                operator*(&local_490);
      FuncBase::printDefinition
                (*ppFVar6,(ostream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::_Rb_tree_const_iterator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>::operator++
                (&local_490);
    }
    bVar1 = std::
            set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
            ::empty((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
                     *)&it);
    if (!bVar1) {
      log(this,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      tcu::TestLog::operator<<(&local_618,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_618,(char (*) [24])"Reference definitions:\n")
      ;
      std::__cxx11::ostringstream::str();
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_638);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_638);
      tcu::MessageBuilder::~MessageBuilder(&local_618);
    }
    std::
    set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
    ::~set((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
            *)&it);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::ostringstream::ostringstream(local_7b0);
    poVar7 = std::operator<<((ostream *)local_7b0,"precision ");
    pcVar8 = glu::getPrecisionName((this->m_ctx).precision);
    poVar7 = std::operator<<(poVar7,pcVar8);
    std::operator<<(poVar7," float;\n");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=
              ((string *)
               &spec.outputs.
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_7d0);
    std::__cxx11::string::~string(local_7d0);
    std::__cxx11::ostringstream::~ostringstream(local_7b0);
    pRVar9 = getRenderContext(this);
    local_7d4.m_bits = (*pRVar9->_vptr_RenderContext[2])();
    local_e8._0_4_ = glu::getContextTypeGLSLVersion((ContextType)local_7d4.m_bits);
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      std::operator+(&local_818,"#extension ",&this->m_extension);
      std::operator+(&local_7f8,&local_818," : require\n");
      std::__cxx11::string::operator=
                ((string *)
                 &spec.outputs.
                  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_818);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)&spec,(long)iVar2);
  switch(iVar2) {
  case 4:
    pVVar15 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in3).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    makeSymbol<deqp::gls::BuiltinPrecisionTests::Void>(&local_850,this,pVVar15);
    pvVar12 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec,3);
    ShaderExecUtil::Symbol::operator=(pvVar12,&local_850);
    ShaderExecUtil::Symbol::~Symbol(&local_850);
  case 3:
    pVVar15 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in2).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    makeSymbol<deqp::gls::BuiltinPrecisionTests::Void>(&local_888,this,pVVar15);
    pvVar12 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec,2);
    ShaderExecUtil::Symbol::operator=(pvVar12,&local_888);
    ShaderExecUtil::Symbol::~Symbol(&local_888);
  case 2:
    pVVar15 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    makeSymbol<deqp::gls::BuiltinPrecisionTests::Void>(&local_8c0,this,pVVar15);
    pvVar12 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec,1);
    ShaderExecUtil::Symbol::operator=(pvVar12,&local_8c0);
    ShaderExecUtil::Symbol::~Symbol(&local_8c0);
  case 1:
    pVVar11 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>::
              operator*((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                         *)variables);
    makeSymbol<tcu::Vector<float,2>>(&local_8f8,this,pVVar11);
    pvVar12 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec,0);
    ShaderExecUtil::Symbol::operator=(pvVar12,&local_8f8);
    ShaderExecUtil::Symbol::~Symbol(&local_8f8);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)&spec.inputs.
               super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar3);
  if (iVar3 != 1) {
    if (iVar3 != 2) goto LAB_00e17090;
    pVVar11 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>::
              operator*(&(variables->out1).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                       );
    makeSymbol<tcu::Vector<float,2>>(&local_930,this,pVVar11);
    pvVar12 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec.inputs.
                               super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
    ShaderExecUtil::Symbol::operator=(pvVar12,&local_930);
    ShaderExecUtil::Symbol::~Symbol(&local_930);
  }
  pVVar13 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
            ::operator*(&(variables->out0).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                       );
  makeSymbol<tcu::Matrix<float,2,2>>(&local_968,this,pVVar13);
  pvVar12 = std::
            vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                          *)&spec.inputs.
                             super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  ShaderExecUtil::Symbol::operator=(pvVar12,&local_968);
  ShaderExecUtil::Symbol::~Symbol(&local_968);
LAB_00e17090:
  de::toString<deqp::gls::BuiltinPrecisionTests::Statement>
            ((string *)
             &executor.
              super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
              .m_data.field_0x8,stmt);
  this_00 = &executor.
             super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
             .m_data.field_0x8;
  std::__cxx11::string::operator=
            ((string *)(spec.globalDeclarations.field_2._M_local_buf + 8),(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  pRVar9 = getRenderContext(this);
  pSVar14 = ShaderExecUtil::createExecutor(pRVar9,(this->m_ctx).shaderType,(ShaderSpec *)local_e8);
  de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>::DefaultDeleter(&local_999);
  de::details::
  UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  ::UniquePtr((UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
               *)local_998,pSVar14);
  outputArr[1] = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::front
                           (&inputs->in0);
  std::
  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::front(&inputs->in1);
  std::
  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::front(&inputs->in2);
  std::
  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::front(&inputs->in3);
  in0.m_data[1].m_hi =
       (double)std::vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>::
               front((vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_> *
                     )((long)&spec.source.field_2 + 8));
  outputArr[0] = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::front
                           ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             *)&outputs.out0.
                                super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar14 = de::details::
            UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
            ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                          *)local_998);
  dVar20 = log(this,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
  (*pSVar14->_vptr_ShaderExecutor[3])(SUB84(dVar20,0),pSVar14,extraout_RAX);
  pSVar14 = de::details::
            UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
            ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                          *)local_998);
  uVar4 = (*pSVar14->_vptr_ShaderExecutor[2])();
  if ((uVar4 & 1) == 0) {
    this_03 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_03,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pSVar14 = de::details::
            UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
            ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                          *)local_998);
  (*pSVar14->_vptr_ShaderExecutor[5])();
  pSVar14 = de::details::
            UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
            ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                          *)local_998);
  value_01 = &in0.m_data[1].m_hi;
  (*pSVar14->_vptr_ShaderExecutor[6])
            (pSVar14,(ulong)outputs.out1.
                            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff,
             outputArr + 1);
  de::details::
  UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  ::~UniquePtr((UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                *)local_998);
  tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)local_a08);
  Void::Void((Void *)((long)&reference0.m_data.m_data[1].m_data[1].m_hi + 7));
  Void::Void((Void *)((long)&reference0.m_data.m_data[1].m_data[1].m_hi + 6));
  Void::Void((Void *)((long)&reference0.m_data.m_data[1].m_data[1].m_hi + 5));
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix
            ((Matrix<tcu::Interval,_2,_2> *)&reference1.m_data[1].m_hi);
  tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)&valueNdx);
  pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
            ::operator*((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                         *)variables);
  Environment::bind<tcu::Vector<float,2>>((Environment *)local_160,pVVar11,(IVal *)local_a08);
  pVVar15 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
            ::operator*(&(variables->in1).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                       );
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)local_160,pVVar15,
             (IVal *)((long)&reference0.m_data.m_data[1].m_data[1].m_hi + 7));
  pVVar15 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
            ::operator*(&(variables->in2).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                       );
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)local_160,pVVar15,
             (IVal *)((long)&reference0.m_data.m_data[1].m_data[1].m_hi + 6));
  pVVar15 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
            ::operator*(&(variables->in3).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                       );
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)local_160,pVVar15,
             (IVal *)((long)&reference0.m_data.m_data[1].m_data[1].m_hi + 5));
  pVVar13 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
            ::operator*(&(variables->out0).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                       );
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)local_160,pVVar13,(IVal *)&reference1.m_data[1].m_hi);
  pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
            ::operator*(&(variables->out1).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                       );
  Environment::bind<tcu::Vector<float,2>>((Environment *)local_160,pVVar11,(IVal *)&valueNdx);
  tcu::Matrix<tcu::Interval,_2,_2>::~Matrix
            ((Matrix<tcu::Interval,_2,_2> *)&reference1.m_data[1].m_hi);
  pVStack_aa8 = (pointer)0x0;
  uVar19 = extraout_XMM0_Da_02;
  uVar21 = extraout_XMM0_Db_02;
  do {
    if (outputs.out1.
        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage <= pVStack_aa8) {
      if (100 < (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        log(this,(double)CONCAT44(uVar21,uVar19));
        tcu::TestLog::operator<<(&local_1198,this_05,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_1198,(char (*) [10])"(Skipped ");
        local_119c = (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + -100;
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_119c);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])" messages.)");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1198);
        uVar19 = extraout_XMM0_Da_05;
        uVar21 = extraout_XMM0_Db_05;
      }
      if ((int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        log(this,(double)CONCAT44(uVar21,uVar19));
        tcu::TestLog::operator<<(&local_1320,this_06,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_1320,(char (*) [5])"All ");
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(unsigned_long *)
                                   &outputs.out1.
                                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [16])" inputs passed.");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1320);
      }
      else {
        log(this,(double)CONCAT44(uVar21,uVar19));
        tcu::TestLog::operator<<(&local_14a0,this_07,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_14a0,
                            (int *)&env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x1283cd1);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(unsigned_long *)
                                   &outputs.out1.
                                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [16])" inputs failed.");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_14a0);
      }
      Environment::~Environment((Environment *)local_160);
      ShaderExecUtil::ShaderSpec::~ShaderSpec((ShaderSpec *)local_e8);
      Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
      ::~Outputs((Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_tcu::Vector<float,_2>_>_>
                  *)((long)&spec.source.field_2 + 8));
      return;
    }
    reference0_1.m_data.m_data[1].m_data[1].m_hi._7_1_ = 1;
    tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_b10);
    tcu::Vector<tcu::Interval,_2>::Vector((Vector<tcu::Interval,_2> *)auStack_b48);
    if (((ulong)pVStack_aa8 & 0xfff) == 0) {
      tcu::TestContext::touchWatchdog((this->super_TestCase).super_TestNode.m_testCtx);
    }
    pFVar16 = (FloatFormat *)
              std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[](&inputs->in0,(size_type)pVStack_aa8);
    round<tcu::Vector<float,2>>
              (&local_ba8,(BuiltinPrecisionTests *)fmt_00,pFVar16,(Vector<float,_2> *)value_01);
    convert<tcu::Vector<float,2>>
              (&local_b78,(BuiltinPrecisionTests *)fmt_00,(FloatFormat *)&local_ba8,(IVal *)value_01
              );
    pVVar11 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>::
              operator*((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                         *)variables);
    pIVar17 = Environment::lookup<tcu::Vector<float,2>>((Environment *)local_160,pVVar11);
    pIVar17->m_data[1].m_lo = local_b78.m_data[1].m_lo;
    pIVar17->m_data[1].m_hi = local_b78.m_data[1].m_hi;
    pIVar17->m_data[0].m_hi = local_b78.m_data[0].m_hi;
    pIVar17->m_data[1].m_hasNaN = local_b78.m_data[1].m_hasNaN;
    *(undefined7 *)&pIVar17->m_data[1].field_0x1 = local_b78.m_data[1]._1_7_;
    pIVar17->m_data[0].m_hasNaN = local_b78.m_data[0].m_hasNaN;
    *(undefined7 *)&pIVar17->m_data[0].field_0x1 = local_b78.m_data[0]._1_7_;
    pIVar17->m_data[0].m_lo = local_b78.m_data[0].m_lo;
    pvVar18 = std::
              vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator[](&inputs->in1,(size_type)pVStack_aa8);
    round<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,pvVar18);
    convert<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,local_baa);
    pVVar15 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>((Environment *)local_160,pVVar15);
    pvVar18 = std::
              vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator[](&inputs->in2,(size_type)pVStack_aa8);
    round<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,pvVar18);
    convert<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,local_bae);
    pVVar15 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in2).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>((Environment *)local_160,pVVar15);
    pvVar18 = std::
              vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator[](&inputs->in3,(size_type)pVStack_aa8);
    round<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,pvVar18);
    convert<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,(IVal *)&ctx.field_0x3e);
    pVVar15 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in3).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>((Environment *)local_160,pVVar15);
    value_01 = (double *)local_160;
    EvalContext::EvalContext
              ((EvalContext *)local_bf8,fmt_00,(this->m_ctx).precision,(Environment *)value_01,0);
    Statement::execute(stmt,(EvalContext *)local_bf8);
    dVar20 = (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
    if (iVar3 == 1) {
LAB_00e178a8:
      pVVar13 = de::
                SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                ::operator*(&(variables->out0).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                           );
      pFVar16 = (FloatFormat *)
                Environment::lookup<tcu::Matrix<float,2,2>>((Environment *)local_160,pVVar13);
      convert<tcu::Matrix<float,2,2>>
                (&local_cb0,(BuiltinPrecisionTests *)&numErrors,pFVar16,(IVal *)value_01);
      tcu::Matrix<tcu::Interval,_2,_2>::operator=
                ((Matrix<tcu::Interval,_2,_2> *)local_b10,&local_cb0);
      tcu::Matrix<tcu::Interval,_2,_2>::~Matrix(&local_cb0);
      value_00 = std::vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>::
                 operator[]((vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                             *)((long)&spec.source.field_2 + 8),(size_type)pVStack_aa8);
      bVar1 = contains<tcu::Matrix<float,2,2>>((IVal *)local_b10,value_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_cd0,"Shader output 0 is outside acceptable range",
                 (allocator<char> *)&builder.field_0x17f);
      bVar1 = tcu::ResultCollector::check(&this->m_status,bVar1,&local_cd0);
      std::__cxx11::string::~string((string *)&local_cd0);
      dVar20 = (double)std::allocator<char>::~allocator((allocator<char> *)&builder.field_0x17f);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        reference0_1.m_data.m_data[1].m_data[1].m_hi._7_1_ = 0;
      }
    }
    else if (iVar3 == 2) {
      pVVar11 = de::
                SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                ::operator*(&(variables->out1).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                           );
      pFVar16 = (FloatFormat *)
                Environment::lookup<tcu::Vector<float,2>>((Environment *)local_160,pVVar11);
      convert<tcu::Vector<float,2>>
                ((IVal *)local_c28,(BuiltinPrecisionTests *)&numErrors,pFVar16,(IVal *)value_01);
      reference1_1.m_data[1]._0_8_ = local_c08;
      reference1_1.m_data[1].m_lo = dStack_c00;
      reference1_1.m_data[0].m_lo = (double)local_c28._16_8_;
      reference1_1.m_data[0].m_hi = (double)local_c28._24_8_;
      auStack_b48 = (undefined1  [8])local_c28._0_8_;
      reference1_1.m_data[0]._0_8_ = local_c28._8_8_;
      value = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         &outputs.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)pVStack_aa8)
      ;
      bVar1 = contains<tcu::Vector<float,2>>((IVal *)auStack_b48,value);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c48,"Shader output 1 is outside acceptable range",&local_c49);
      bVar1 = tcu::ResultCollector::check(&this->m_status,bVar1,&local_c48);
      std::__cxx11::string::~string((string *)&local_c48);
      std::allocator<char>::~allocator(&local_c49);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        reference0_1.m_data.m_data[1].m_data[1].m_hi._7_1_ = 0;
      }
      goto LAB_00e178a8;
    }
    if ((reference0_1.m_data.m_data[1].m_data[1].m_hi._7_1_ & 1) == 0) {
      env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
    }
    if (((reference0_1.m_data.m_data[1].m_data[1].m_hi._7_1_ & 1) == 0) &&
       ((int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x65)) {
      log(this,dVar20);
      tcu::TestLog::message((MessageBuilder *)local_e58,this_04);
      if ((reference0_1.m_data.m_data[1].m_data[1].m_hi._7_1_ & 1) == 0) {
        local_15f0 = (char (*) [7])0x1279960;
      }
      else {
        local_15f0 = (char (*) [7])0x1279959;
      }
      pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_e58,local_15f0);
      tcu::MessageBuilder::operator<<(pMVar5,(char (*) [10])" sample:\n");
      if (0 < iVar2) {
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_e58,(char (*) [2])0x12c5a38);
        pVVar11 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                  ::operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                                *)variables);
        Variable<tcu::Vector<float,2>>::getName_abi_cxx11_(&local_e78,pVVar11);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_e78);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x12b1e21);
        pFVar16 = (FloatFormat *)
                  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                  operator[](&inputs->in0,(size_type)pVStack_aa8);
        valueToString<tcu::Vector<float,2>>
                  (&local_e98,(BuiltinPrecisionTests *)&numErrors,pFVar16,
                   (Vector<float,_2> *)value_01);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_e98);
        tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x12b9f11);
        std::__cxx11::string::~string((string *)&local_e98);
        std::__cxx11::string::~string((string *)&local_e78);
      }
      if (1 < iVar2) {
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_e58,(char (*) [2])0x12c5a38);
        pVVar15 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator->(&(variables->in1).
                                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                              );
        Variable<deqp::gls::BuiltinPrecisionTests::Void>::getName_abi_cxx11_(&local_eb8,pVVar15);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_eb8);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x12b1e21);
        pvVar18 = std::
                  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator[](&inputs->in1,(size_type)pVStack_aa8);
        valueToString<deqp::gls::BuiltinPrecisionTests::Void>
                  (&local_ed8,(FloatFormat *)&numErrors,pvVar18);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_ed8);
        tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x12b9f11);
        std::__cxx11::string::~string((string *)&local_ed8);
        std::__cxx11::string::~string((string *)&local_eb8);
      }
      if (2 < iVar2) {
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_e58,(char (*) [2])0x12c5a38);
        pVVar15 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator->(&(variables->in2).
                                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                              );
        Variable<deqp::gls::BuiltinPrecisionTests::Void>::getName_abi_cxx11_(&local_ef8,pVVar15);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_ef8);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x12b1e21);
        pvVar18 = std::
                  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator[](&inputs->in2,(size_type)pVStack_aa8);
        valueToString<deqp::gls::BuiltinPrecisionTests::Void>
                  (&local_f18,(FloatFormat *)&numErrors,pvVar18);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_f18);
        tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x12b9f11);
        std::__cxx11::string::~string((string *)&local_f18);
        std::__cxx11::string::~string((string *)&local_ef8);
      }
      if (3 < iVar2) {
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_e58,(char (*) [2])0x12c5a38);
        pVVar15 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator->(&(variables->in3).
                                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                              );
        Variable<deqp::gls::BuiltinPrecisionTests::Void>::getName_abi_cxx11_(&local_f38,pVVar15);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_f38);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x12b1e21);
        pvVar18 = std::
                  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator[](&inputs->in3,(size_type)pVStack_aa8);
        valueToString<deqp::gls::BuiltinPrecisionTests::Void>
                  (&local_f58,(FloatFormat *)&numErrors,pvVar18);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_f58);
        tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x12b9f11);
        std::__cxx11::string::~string((string *)&local_f58);
        std::__cxx11::string::~string((string *)&local_f38);
      }
      if (0 < iVar3) {
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_e58,(char (*) [2])0x12c5a38);
        pVVar13 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                  ::operator->(&(variables->out0).
                                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                              );
        Variable<tcu::Matrix<float,2,2>>::getName_abi_cxx11_(&local_f78,pVVar13);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_f78);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x12b1e21);
        pFVar16 = (FloatFormat *)
                  std::vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                  ::operator[]((vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                                *)((long)&spec.source.field_2 + 8),(size_type)pVStack_aa8);
        valueToString<tcu::Matrix<float,2,2>>
                  (&local_f98,(BuiltinPrecisionTests *)&numErrors,pFVar16,
                   (Matrix<float,_2,_2> *)value_01);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_f98);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x12b9f11);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [18])"\tExpected range: ");
        intervalToString<tcu::Matrix<float,2,2>>
                  (&local_fb8,(BuiltinPrecisionTests *)&numErrors,(FloatFormat *)local_b10,
                   (IVal *)value_01);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_fb8);
        tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x12b9f11);
        std::__cxx11::string::~string((string *)&local_fb8);
        std::__cxx11::string::~string((string *)&local_f98);
        std::__cxx11::string::~string((string *)&local_f78);
      }
      if (1 < iVar3) {
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_e58,(char (*) [2])0x12c5a38);
        pVVar11 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                  ::operator->(&(variables->out1).
                                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>_>
                              );
        Variable<tcu::Vector<float,2>>::getName_abi_cxx11_(&local_fd8,pVVar11);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_fd8);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x12b1e21);
        pFVar16 = (FloatFormat *)
                  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                  operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              *)&outputs.out0.
                                 super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)pVStack_aa8);
        valueToString<tcu::Vector<float,2>>
                  (&local_ff8,(BuiltinPrecisionTests *)&numErrors,pFVar16,
                   (Vector<float,_2> *)value_01);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_ff8);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x12b9f11);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [18])"\tExpected range: ");
        intervalToString<tcu::Vector<float,2>>
                  (&local_1018,(BuiltinPrecisionTests *)&numErrors,(FloatFormat *)auStack_b48,
                   (IVal *)value_01);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1018);
        tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x12b9f11);
        std::__cxx11::string::~string((string *)&local_1018);
        std::__cxx11::string::~string((string *)&local_ff8);
        std::__cxx11::string::~string((string *)&local_fd8);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_e58,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_e58);
    }
    tcu::Matrix<tcu::Interval,_2,_2>::~Matrix((Matrix<tcu::Interval,_2,_2> *)local_b10);
    pVStack_aa8 = (pointer)((long)pVStack_aa8->m_data + 1);
    uVar19 = extraout_XMM0_Da_04;
    uVar21 = extraout_XMM0_Db_04;
  } while( true );
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}